

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::Set(MP<8UL,_GF2::MOGrevlex<8UL>_> *this,size_t pos,bool val)

{
  ulong *puVar1;
  byte bVar2;
  const_iterator __position;
  undefined7 in_register_00000011;
  _List_node_base *p_Var3;
  
  if ((int)CONCAT71(in_register_00000011,val) != 0) {
    bVar2 = (byte)pos & 0x3f;
    p_Var3 = (_List_node_base *)this;
    while (p_Var3 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var3->_M_next)->
                    super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                    super__List_node_base._M_next, p_Var3 != (_List_node_base *)this) {
      puVar1 = (ulong *)((long)(p_Var3 + 1) + (pos >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    }
    Normalize(this);
    return;
  }
  __position._M_node =
       (this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
       super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  while (__position._M_node != (_List_node_base *)this) {
    if (((ulong)(&__position._M_node[1]._M_next)[pos >> 6] & 1L << ((byte)pos & 0x3f)) == 0) {
      __position._M_node = (__position._M_node)->_M_next;
    }
    else {
      __position._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::erase
                     (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,__position);
    }
  }
  return;
}

Assistant:

void Set(size_t pos, bool val)
	{	
		if (val == 0)
		{
			for (iterator iter = begin(); iter != end();)
				if (iter->Test(pos))
					iter = erase(iter);
				else
					++iter;
		}
		else
		{
			for (iterator iter = begin(); iter != end(); ++iter)
				iter->Set(pos, 0);
			Normalize();
		}
	}